

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O0

int TVMArrayFromDLPack(DLManagedTensor *from,TVMArrayHandle *out)

{
  DLTensor *pDVar1;
  runtime_error *_except_;
  NDArray local_28;
  TVMArrayHandle *local_20;
  TVMArrayHandle *out_local;
  DLManagedTensor *from_local;
  
  local_20 = out;
  out_local = (TVMArrayHandle *)from;
  tvm::runtime::NDArray::FromDLPack(&local_28,from);
  pDVar1 = tvm::runtime::NDArray::Internal::MoveAsDLTensor(&local_28);
  *local_20 = pDVar1;
  tvm::runtime::NDArray::~NDArray(&local_28);
  return 0;
}

Assistant:

int TVMArrayFromDLPack(DLManagedTensor *from,
                       TVMArrayHandle *out) {
  API_BEGIN();
  *out = NDArray::Internal::MoveAsDLTensor(NDArray::FromDLPack(from));
  API_END();
}